

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strings.c
# Opt level: O0

int STRING_concat_with_STRING(STRING_HANDLE s1,STRING_HANDLE s2)

{
  LOGGER_LOG p_Var1;
  size_t sVar2;
  size_t sVar3;
  char *pcVar4;
  size_t local_78;
  long local_70;
  ulong local_68;
  LOGGER_LOG l_1;
  char *temp;
  size_t realloc_size;
  size_t s2Length;
  size_t s1Length;
  STRING *src;
  STRING *dest;
  LOGGER_LOG l;
  int result;
  STRING_HANDLE s2_local;
  STRING_HANDLE s1_local;
  
  if ((s1 == (STRING_HANDLE)0x0) || (s2 == (STRING_HANDLE)0x0)) {
    p_Var1 = xlogging_get_log_function();
    if (p_Var1 != (LOGGER_LOG)0x0) {
      (*p_Var1)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-umqtt-c/deps/c-utility/src/strings.c"
                ,"STRING_concat_with_STRING",0x1ba,1,"Invalid argument specified");
    }
    l._4_4_ = 0x1bb;
  }
  else {
    sVar2 = strlen(s1->s);
    sVar3 = strlen(s2->s);
    if (sVar2 < -sVar3 - 1) {
      local_68 = sVar2 + sVar3;
    }
    else {
      local_68 = 0xffffffffffffffff;
    }
    if (local_68 < 0xfffffffffffffffe) {
      if (sVar2 < -sVar3 - 1) {
        local_70 = sVar2 + sVar3;
      }
      else {
        local_70 = -1;
      }
      local_78 = local_70 + 1;
    }
    else {
      local_78 = 0xffffffffffffffff;
    }
    if ((local_78 == 0xffffffffffffffff) ||
       (pcVar4 = (char *)realloc(s1->s,local_78), pcVar4 == (char *)0x0)) {
      p_Var1 = xlogging_get_log_function();
      if (p_Var1 != (LOGGER_LOG)0x0) {
        (*p_Var1)(AZ_LOG_ERROR,
                  "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-umqtt-c/deps/c-utility/src/strings.c"
                  ,"STRING_concat_with_STRING",0x1ca,1,"Failure reallocating value, size:%zu",
                  local_78);
      }
      l._4_4_ = 0x1cb;
    }
    else {
      s1->s = pcVar4;
      memcpy(s1->s + sVar2,s2->s,sVar3 + 1);
      l._4_4_ = 0;
    }
  }
  return l._4_4_;
}

Assistant:

int STRING_concat_with_STRING(STRING_HANDLE s1, STRING_HANDLE s2)
{
    int result;
    if ((s1 == NULL) || (s2 == NULL))
    {
        /* Codes_SRS_STRING_07_035: [String_Concat_with_STRING shall return a nonzero number if an error is encountered.] */
        LogError("Invalid argument specified");
        result = MU_FAILURE;
    }
    else
    {
        STRING* dest = (STRING*)s1;
        STRING* src = (STRING*)s2;

        size_t s1Length = strlen(dest->s);
        size_t s2Length = strlen(src->s);
        size_t realloc_size = safe_add_size_t(safe_add_size_t(s1Length, s2Length), 1);
        char* temp;
        if (realloc_size == SIZE_MAX ||
            (temp = (char*)realloc(dest->s, realloc_size)) == NULL)
        {
            /* Codes_SRS_STRING_07_035: [String_Concat_with_STRING shall return a nonzero number if an error is encountered.] */
            LogError("Failure reallocating value, size:%zu", realloc_size);
            result = MU_FAILURE;
        }
        else
        {
            dest->s = temp;
            /* Codes_SRS_STRING_07_034: [String_Concat_with_STRING shall concatenate a given STRING_HANDLE variable with a source STRING_HANDLE.] */
            (void)memcpy(dest->s + s1Length, src->s, s2Length + 1);
            result = 0;
        }
    }
    return result;
}